

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O3

void test_linear_hash_local_record_increments_decrements(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  linear_hash_table_t *linear_hash;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  linear_hash_bucket_t local_28;
  
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  test_linear_hash_create(tc,linear_hash,key_type_numeric_signed,4,4,4);
  local_28.idx = -1;
  local_28.record_count = -1;
  local_28.overflow_location._0_4_ = 0xffffffff;
  local_28.overflow_location._4_4_ = 0xffffffff;
  linear_hash_get_bucket(0,&local_28,linear_hash);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_28.record_count == 0),0x1c3,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    local_2c = 0;
    local_30 = 0x13;
    test_linear_hash_insert(tc,&local_2c,&local_30,'\0',1,'\x01',linear_hash);
    linear_hash_get_bucket(0,&local_28,linear_hash);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(local_28.record_count == 1),0x1c6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      local_34 = 0;
      test_linear_hash_delete(tc,&local_34,'\0',1,linear_hash);
      linear_hash_get_bucket(0,&local_28,linear_hash);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(local_28.record_count == 0),0x1c9,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        test_linear_hash_destroy(tc,linear_hash);
        return;
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_local_record_increments_decrements(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	linear_hash_bucket_t *bucket = alloca(sizeof(linear_hash_bucket_t));

	bucket->record_count		= -1;
	bucket->idx					= -1;
	bucket->overflow_location	= -1;

	linear_hash_get_bucket(0, bucket, linear_hash);

	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == bucket->record_count);
	test_linear_hash_insert(tc, IONIZE(0, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	linear_hash_get_bucket(0, bucket, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == bucket->record_count);
	test_linear_hash_delete(tc, IONIZE(0, int), err_ok, 1, linear_hash);
	linear_hash_get_bucket(0, bucket, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == bucket->record_count);

	test_linear_hash_takedown(tc, linear_hash);
}